

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MainWindow.cpp
# Opt level: O0

void __thiscall MainWindow::MainWindow(MainWindow *this)

{
  QSplitter *pQVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Module *this_00;
  TableModel<trackerboy::Instrument> *this_01;
  SongListModel *this_02;
  SongModel *this_03;
  PatternModel *this_04;
  TableModel<trackerboy::Waveform> *this_05;
  Renderer *this_06;
  int *piVar6;
  undefined1 auVar7 [16];
  QArrayDataPointer<char16_t> local_748;
  QString local_730;
  Int local_718;
  Categories local_714;
  undefined1 local_710 [8];
  Config config;
  QVariant local_200;
  QByteArray local_1e0;
  QVariant local_1c8;
  QVariant local_1a8;
  QByteArray local_188;
  anon_class_1_0_00000001 local_169;
  undefined1 local_168 [7];
  anon_class_1_0_00000001 restoreSplitter;
  QVariant local_148;
  undefined1 local_128 [8];
  QByteArray windowState;
  QPoint local_108;
  QPoint local_100;
  int local_f8;
  int local_f4;
  undefined1 local_f0 [8];
  QRect newGeometry;
  QRect availableGeometry;
  int MAX_HEIGHT;
  int MAX_WIDTH;
  QVariant local_b0;
  QVariant local_90;
  QByteArray local_70;
  undefined1 local_58 [8];
  QSettings settings;
  QIcon local_48 [28];
  QFlags<Qt::WindowType> local_2c;
  MainWindow *local_28;
  MainWindow *this_local;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  local_28 = this;
  QFlags<Qt::WindowType>::QFlags(&local_2c);
  QMainWindow::QMainWindow
            (&this->super_QMainWindow,(QWidget *)0x0,(QFlags_conflict1 *)(ulong)local_2c.i);
  *(undefined ***)this = &PTR_metaObject_002d4e60;
  *(undefined ***)&this->field_0x10 = &PTR__MainWindow_002d5018;
  AudioEnumerator::AudioEnumerator(&this->mAudioEnumerator);
  MidiEnumerator::MidiEnumerator(&this->mMidiEnumerator);
  tr(&this->mUntitledString,"Untitled",(char *)0x0,-1);
  PianoInput::PianoInput(&this->mPianoInput);
  Palette::Palette(&this->mPalette);
  Midi::Midi(&this->mMidi,(QObject *)0x0);
  this->mModule = (Module *)0x0;
  ModuleFile::ModuleFile(&this->mModuleFile);
  this->mErrorSinceLastConfig = false;
  trackerboy::Frame::Frame(&this->mLastEngineFrame);
  this->mFrameSkip = 0;
  this->mAutosave = false;
  this->mAutosaveIntervalMs = 30000;
  QBasicTimer::QBasicTimer(&this->mAutosaveTimer);
  this->mAudioDiag = (AudioDiagDialog *)0x0;
  this->mTempoCalc = (TempoCalculator *)0x0;
  this->mCommentsDialog = (CommentsDialog *)0x0;
  this->mInstrumentEditor = (InstrumentEditor *)0x0;
  this->mWaveEditor = (WaveEditor *)0x0;
  this->mHistoryDialog = (PersistantDialog *)0x0;
  this->mEffectsListDialog = (EffectsListDialog *)0x0;
  this_00 = (Module *)operator_new(0x1a8);
  Module::Module(this_00,(QObject *)this);
  this->mModule = this_00;
  this_01 = (TableModel<trackerboy::Instrument> *)operator_new(0x50);
  TableModel<trackerboy::Instrument>::TableModel(this_01,this->mModule,(QObject *)this);
  this->mInstrumentModel = this_01;
  this_02 = (SongListModel *)operator_new(0x30);
  SongListModel::SongListModel(this_02,this->mModule,(QObject *)this);
  this->mSongListModel = this_02;
  this_03 = (SongModel *)operator_new(0x20);
  SongModel::SongModel(this_03,this->mModule,(QObject *)this);
  this->mSongModel = this_03;
  this_04 = (PatternModel *)operator_new(0xf0);
  PatternModel::PatternModel(this_04,this->mModule,this->mSongModel,(QObject *)this);
  this->mPatternModel = this_04;
  this_05 = (TableModel<trackerboy::Waveform> *)operator_new(0x50);
  TableModel<trackerboy::Waveform>::TableModel(this_05,this->mModule,(QObject *)this);
  this->mWaveModel = this_05;
  this_06 = (Renderer *)operator_new(0x1518);
  Renderer::Renderer(this_06,this->mModule,(QObject *)this);
  this->mRenderer = this_06;
  setupUi(this);
  IconLocator::getAppIcon();
  QWidget::setWindowIcon((QIcon *)this);
  QIcon::~QIcon(local_48);
  QSettings::QSettings((QSettings *)local_58,(QObject *)0x0);
  QSettings::beginGroup((QString *)local_58);
  QByteArray::QByteArray((QByteArray *)&MAX_HEIGHT);
  QVariant::QVariant(&local_b0,(QByteArray *)&MAX_HEIGHT);
  QSettings::value((QString *)&local_90,(QVariant *)local_58);
  QVariant::toByteArray();
  bVar2 = QWidget::restoreGeometry((QByteArray *)this);
  QByteArray::~QByteArray(&local_70);
  QVariant::~QVariant(&local_90);
  QVariant::~QVariant(&local_b0);
  QByteArray::~QByteArray((QByteArray *)&MAX_HEIGHT);
  if (((bVar2 ^ 0xff) & 1) != 0) {
    availableGeometry.y2 = 0x500;
    availableGeometry.x2 = 0x2d0;
    QGuiApplication::primaryScreen();
    auVar7 = QScreen::availableGeometry();
    availableGeometry._0_8_ = auVar7._8_8_;
    newGeometry._8_8_ = auVar7._0_8_;
    iVar4 = QRect::width((QRect *)&newGeometry.x2);
    local_f4 = iVar4 * 3;
    if (iVar4 * 3 < 0) {
      local_f4 = iVar4 * 3 + 3;
    }
    local_f4 = local_f4 >> 2;
    piVar6 = std::min<int>(&availableGeometry.y2,&local_f4);
    iVar4 = *piVar6;
    iVar5 = QRect::height((QRect *)&newGeometry.x2);
    local_f8 = iVar5 * 3;
    if (iVar5 * 3 < 0) {
      local_f8 = iVar5 * 3 + 3;
    }
    local_f8 = local_f8 >> 2;
    piVar6 = std::min<int>(&availableGeometry.x2,&local_f8);
    QRect::QRect((QRect *)local_f0,0,0,iVar4,*piVar6);
    local_108 = QRect::center((QRect *)&newGeometry.x2);
    windowState.d.size = (qsizetype)QRect::center((QRect *)local_f0);
    local_100 = ::operator-(&local_108,(QPoint *)&windowState.d.size);
    QRect::moveTo((QRect *)local_f0,&local_100);
    QWidget::setGeometry((QRect *)this);
  }
  QVariant::QVariant((QVariant *)local_168);
  QSettings::value((QString *)&local_148,(QVariant *)local_58);
  QVariant::toByteArray();
  QVariant::~QVariant(&local_148);
  QVariant::~QVariant((QVariant *)local_168);
  bVar3 = QByteArray::isEmpty((QByteArray *)local_128);
  if (bVar3) {
    initState(this);
  }
  else {
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    QMainWindow::addToolBar((QToolBar *)this);
    bVar2 = QMainWindow::restoreState((QByteArray *)this,(int)local_128);
    if ((bVar2 & 1) == 0) {
      initState(this);
    }
  }
  pQVar1 = this->mVSplitter;
  QVariant::QVariant(&local_1c8);
  QSettings::value((QString *)&local_1a8,(QVariant *)local_58);
  QVariant::toByteArray();
  MainWindow::anon_class_1_0_00000001::operator()(&local_169,pQVar1,&local_188,0.625);
  QByteArray::~QByteArray(&local_188);
  QVariant::~QVariant(&local_1a8);
  QVariant::~QVariant(&local_1c8);
  pQVar1 = this->mHSplitter;
  QVariant::QVariant((QVariant *)
                     ((long)&config.mShortcuts.mTable._M_elems[0x20].
                             super__Optional_base<QKeySequence,_false,_false>._M_payload.
                             super__Optional_payload<QKeySequence,_true,_false,_false> + 8));
  QSettings::value((QString *)&local_200,(QVariant *)local_58);
  QVariant::toByteArray();
  MainWindow::anon_class_1_0_00000001::operator()(&local_169,pQVar1,&local_1e0,0.625);
  QByteArray::~QByteArray(&local_1e0);
  QVariant::~QVariant(&local_200);
  QVariant::~QVariant((QVariant *)
                      ((long)&config.mShortcuts.mTable._M_elems[0x20].
                              super__Optional_base<QKeySequence,_false,_false>._M_payload.
                              super__Optional_payload<QKeySequence,_true,_false,_false> + 8));
  ModuleFile::setName(&this->mModuleFile,&this->mUntitledString);
  updateWindowTitle(this);
  Config::Config((Config *)local_710);
  Config::readSettings((Config *)local_710,&this->mAudioEnumerator,&this->mMidiEnumerator);
  QFlags<Config::Category>::QFlags(&local_714,CategoryAll);
  local_718 = (Int)applyConfig(this,(Config *)local_710,local_714,(QString *)0x0);
  Config::writeSettings((Config *)local_710,&this->mAudioEnumerator,&this->mMidiEnumerator);
  QWidget::setAcceptDrops(SUB81(this,0));
  local_10 = &local_748;
  str = L"\nQToolBar QLabel {\n    padding-left: 3px;\n    padding-right: 3px;\n}\n    ";
  this_local = (MainWindow *)anon_var_dwarf_2dfbdc;
  QArrayDataPointer<char16_t>::QArrayDataPointer
            (&local_748,(Data *)0x0,
             L"\nQToolBar QLabel {\n    padding-left: 3px;\n    padding-right: 3px;\n}\n    ",0x48);
  QString::QString(&local_730,&local_748);
  QWidget::setStyleSheet((QString *)this);
  QString::~QString(&local_730);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_748);
  Config::~Config((Config *)local_710);
  QByteArray::~QByteArray((QByteArray *)local_128);
  QSettings::~QSettings((QSettings *)local_58);
  return;
}

Assistant:

MainWindow::MainWindow() :
    QMainWindow(),
    mAudioEnumerator(),
    mUntitledString(tr("Untitled")),
    mPianoInput(),
    mMidi(),
    mModule(),
    mModuleFile(),
    mErrorSinceLastConfig(false),
    mLastEngineFrame(),
    mFrameSkip(0),
    mAutosave(false),
    mAutosaveIntervalMs(30000),
    mAudioDiag(nullptr),
    mTempoCalc(nullptr),
    mCommentsDialog(nullptr),
    mInstrumentEditor(nullptr),
    mWaveEditor(nullptr),
    mHistoryDialog(nullptr),
    mEffectsListDialog(nullptr)
{

    // create models
    mModule = new Module(this);
    mInstrumentModel = new InstrumentListModel(*mModule, this);
    mSongListModel = new SongListModel(*mModule, this);
    mSongModel = new SongModel(*mModule, this);
    mPatternModel = new PatternModel(*mModule, *mSongModel, this);
    mWaveModel = new WaveListModel(*mModule, this);

    mRenderer = new Renderer(*mModule, this);

    setupUi();

    // read in application configuration
    //mConfig.readSettings(mAudioEnumerator, mMidiEnumerator);
    
    setWindowIcon(IconLocator::getAppIcon());

    QSettings settings;
    settings.beginGroup(TU::KEY_MAIN_WINDOW);

    // restore geomtry from the last session
    if (!restoreGeometry(settings.value(TU::KEY_GEOMETRY, QByteArray()).toByteArray())) {
        // no saved geometry, initialize it
        // we will take 3/4 of the primary screen's width and height, but we
        // will take no more than 1280x720

        // maximum initial resolution
        constexpr int MAX_WIDTH = 1280;
        constexpr int MAX_HEIGHT = 720;

        // get the available geometry for the primary screen
        auto const availableGeometry = QApplication::primaryScreen()->availableGeometry();

        QRect newGeometry(
            0,
            0, 
            std::min(MAX_WIDTH, availableGeometry.width() * 3 / 4),
            std::min(MAX_HEIGHT, availableGeometry.height() * 3 / 4)
        );

        newGeometry.moveTo(availableGeometry.center() - newGeometry.center());
        setGeometry(newGeometry);
    }

    // restore window state if it exists
    auto const windowState = settings.value(TU::KEY_WINDOW_STATE).toByteArray();
    if (windowState.isEmpty()) {
        // default layout
        initState();
    } else {
        addToolBar(mToolbarFile);
        addToolBar(mToolbarEdit);
        addToolBar(mToolbarSong);
        addToolBar(mToolbarTracker);
        addToolBar(mToolbarInput);
        if (!restoreState(windowState, TU::WINDOW_STATE_VERSION)) {
            initState();
        }
    }

    // restore splitter sizes
    auto restoreSplitter = [](QSplitter &splitter, QByteArray const& state, float defaultRatio) {
        if (!splitter.restoreState(state)) {
            rationSplitter(splitter, defaultRatio);
        }
    };
    restoreSplitter(*mVSplitter, settings.value(TU::KEY_VSPLITTER).toByteArray(), TU::DEFAULT_VSPLITTER_RATIO);
    restoreSplitter(*mHSplitter, settings.value(TU::KEY_HSPLITTER).toByteArray(), TU::DEFAULT_HSPLITTER_RATIO);

    mModuleFile.setName(mUntitledString);
    updateWindowTitle();

    // apply the read in configuration
    Config config;
    config.readSettings(mAudioEnumerator, mMidiEnumerator);
    applyConfig(config, Config::CategoryAll);
    config.writeSettings(mAudioEnumerator, mMidiEnumerator);

    setAcceptDrops(true);

    setStyleSheet(QStringLiteral(R"stylesheet(
QToolBar QLabel {
    padding-left: 3px;
    padding-right: 3px;
}
    )stylesheet"));
}